

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureViewVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::TextureViewVkImpl::~TextureViewVkImpl(TextureViewVkImpl *this)

{
  void *in_RSI;
  TextureViewVkImpl *this_local;
  
  ~TextureViewVkImpl(this);
  RefCountedObject<Diligent::ITextureViewVk>::operator_delete
            ((RefCountedObject<Diligent::ITextureViewVk> *)this,in_RSI);
  return;
}

Assistant:

TextureViewVkImpl::~TextureViewVkImpl()
{
    if (FramebufferCache* FBCache = m_pDevice->GetFramebufferCache())
    {
        if (m_Desc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL ||
            m_Desc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL ||
            m_Desc.ViewType == TEXTURE_VIEW_RENDER_TARGET ||
            m_Desc.ViewType == TEXTURE_VIEW_SHADING_RATE)
        {
            FBCache->OnDestroyImageView(m_ImageView);
        }
    }
    m_pDevice->SafeReleaseDeviceObject(std::move(m_ImageView), m_pTexture->GetDesc().ImmediateContextMask);
}